

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

int dpfb::unicode::encodeUtf16(char32_t cp,char16_t *out)

{
  char16_t *out_local;
  char32_t cp_local;
  
  if ((uint)cp < 0x10000) {
    *out = (char16_t)cp;
    out_local._4_4_ = 1;
  }
  else if ((uint)cp < 0x110000) {
    *out = ((ushort)((uint)(cp + L'\xffff0000') >> 10) & 0x3ff) + L'\xd800';
    out[1] = ((ushort)(cp + L'\xffff0000') & 0x3ff) + L'\xdc00';
    out_local._4_4_ = 2;
  }
  else {
    *out = L'�';
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

int encodeUtf16(char32_t cp, char16_t out[2])
{
    if (cp < 0x10000) {
        out[0] = cp;
        return 1;
    } else if (cp <= maxCp) {
        cp -= 0x10000;
        out[0] = leadingSurrogateMin + ((cp >> 10) & 0x3ff);
        out[1] = trailingSurrogateMin + (cp & 0x3ff);
        return 2;
    }

    out[0] = replacementCharacter;
    return 1;
}